

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O0

void __thiscall
onmt::SentencePieceLearner::SentencePieceLearner
          (SentencePieceLearner *this,bool verbose,string *opts,string *input_filename,
          bool keep_vocab,bool keep_input_file)

{
  string *in_RCX;
  string *in_RDX;
  undefined8 *in_RDI;
  byte in_R8B;
  byte in_R9B;
  Tokenizer *in_stack_00000030;
  bool in_stack_0000003f;
  undefined6 in_stack_00000040;
  string *this_00;
  
  this_00 = in_RCX;
  SubwordLearner::SubwordLearner
            ((SubwordLearner *)CONCAT17(keep_vocab,CONCAT16(keep_input_file,in_stack_00000040)),
             in_stack_0000003f,in_stack_00000030);
  *in_RDI = &PTR__SentencePieceLearner_006efc08;
  std::__cxx11::string::string((string *)(in_RDI + 4),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RCX);
  *(byte *)(in_RDI + 0xc) = in_R8B & 1;
  std::unique_ptr<std::ofstream,std::default_delete<std::ofstream>>::
  unique_ptr<std::default_delete<std::ofstream>,void>
            ((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
              *)this_00);
  *(byte *)(in_RDI + 0xe) = in_R9B & 1;
  return;
}

Assistant:

SentencePieceLearner::SentencePieceLearner(bool verbose,
                                             const std::string& opts,
                                             const std::string& input_filename,
                                             bool keep_vocab,
                                             bool keep_input_file)
    : SubwordLearner(verbose)
    , _args(opts)
    , _input_filename(input_filename)
    , _keep_vocab(keep_vocab)
    , _keep_input_file(keep_input_file)
  {
  }